

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QString * __thiscall
CPP::WriteInitialization::writeStringListProperty
          (QString *__return_storage_ptr__,WriteInitialization *this,DomStringList *list)

{
  bool bVar1;
  Language LVar2;
  QTextStream *pQVar3;
  qsizetype i;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  char local_c1;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_48,__return_storage_ptr__,3);
  LVar2 = language::language();
  if (LVar2 == Python) {
    QTextStream::operator<<((QTextStream *)&local_48,'[');
    local_c1 = ']';
  }
  else if (LVar2 == Cpp) {
    local_c1 = '}';
    QTextStream::operator<<((QTextStream *)&local_48,"QStringList{");
  }
  else {
    local_c1 = '}';
  }
  local_60.d = (list->m_string).d.d;
  local_60.ptr = (list->m_string).d.ptr;
  uVar5 = (list->m_string).d.size;
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_60.size = uVar5;
  if (uVar5 != 0) {
    bVar1 = needsTranslation<DomStringList>(list);
    if (bVar1) {
      local_78.d = (list->m_attr_comment).d.d;
      local_78.ptr = (list->m_attr_comment).d.ptr;
      local_78.size = (list->m_attr_comment).d.size;
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        uVar5 = local_60.size;
      }
      lVar6 = 0;
      while (uVar5 != 0) {
        pQVar3 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_48,'\n');
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&this->m_indent);
        pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    ");
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (char16_t *)0x0;
        local_a8.size = 0;
        trCall((QString *)&local_90,this,(QString *)((long)&((local_60.ptr)->d).d + lVar6),
               (QString *)&local_78,(QString *)&local_a8);
        QTextStream::operator<<(pQVar3,(QString *)&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        if (uVar5 != 1) {
          QTextStream::operator<<((QTextStream *)&local_48,',');
        }
        lVar6 = lVar6 + 0x18;
        uVar5 = uVar5 - 1;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
    else {
      lVar6 = 0;
      for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          QTextStream::operator<<((QTextStream *)&local_48,", ");
        }
        local_78.d = (Data *)((long)&((local_60.ptr)->d).d + lVar6);
        local_78.ptr = (char16_t *)&this->m_dindent;
        language::_string<true>::format((_string<true> *)&local_78,(QTextStream *)&local_48);
        lVar6 = lVar6 + 0x18;
      }
    }
  }
  QTextStream::operator<<((QTextStream *)&local_48,local_c1);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
  QTextStream::~QTextStream((QTextStream *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::writeStringListProperty(const DomStringList *list) const
{
    QString propertyValue;
    QTextStream str(&propertyValue);
    char trailingDelimiter = '}';
    switch (language::language()) {
     case Language::Cpp:
        str << "QStringList{";
        break;
    case Language::Python:
       str << '[';
       trailingDelimiter = ']';
       break;
    }
    const QStringList values = list->elementString();
    if (!values.isEmpty()) {
        if (needsTranslation(list)) {
            const QString comment = list->attributeComment();
            const qsizetype last = values.size() - 1;
            for (qsizetype i = 0; i <= last; ++i) {
                str << '\n' << m_indent << "    " << trCall(values.at(i), comment);
                if (i != last)
                    str << ',';
            }
        } else {
            for (qsizetype i = 0; i < values.size(); ++i) {
                if (i)
                    str << ", ";
                str << language::qstring(values.at(i), m_dindent);
            }
        }
    }
    str << trailingDelimiter;
    return propertyValue;
}